

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::Path::parse(Path *__return_storage_ptr__,Path *this,StringPtr path)

{
  Fault firstElement;
  long lVar1;
  Exception *pEVar2;
  size_t sVar3;
  size_t capacity;
  StringPtr path_00;
  StringPtr path_local;
  Fault f;
  
  path_local.content.size_ = (size_t)path.content.ptr;
  path_local.content.ptr = (char *)this;
  if (((char *)0x1 < path_local.content.size_) && (*(char *)&(this->parts).ptr == '/')) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::StringPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x35,FAILED,"!path.startsWith(\"/\")",
               "\"expected a relative path, got absolute\", path",
               (char (*) [39])"expected a relative path, got absolute",&path_local);
    kj::_::Debug::Fault::~Fault(&f);
  }
  if (path_local.content.ptr + (path_local.content.size_ - 1) == path_local.content.ptr) {
    capacity = 1;
  }
  else {
    capacity = 1;
    lVar1 = 0;
    do {
      capacity = capacity + (path_local.content.ptr[lVar1] == '/');
      lVar1 = lVar1 + 1;
    } while (path_local.content.size_ - 1 != lVar1);
  }
  sVar3 = 0;
  pEVar2 = (Exception *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  path_00.content.size_ = sVar3;
  path_00.content.ptr = (char *)path_local.content.size_;
  f.exception = pEVar2;
  evalImpl(__return_storage_ptr__,(Path *)&f,(Vector<kj::String> *)path_local.content.ptr,path_00);
  firstElement.exception = f.exception;
  if (f.exception != (Exception *)0x0) {
    f.exception = (Exception *)0x0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement.exception,0x18,
               ((long)pEVar2 - (long)firstElement.exception >> 3) * -0x5555555555555555,
               ((long)((long)pEVar2 + (capacity * 0x18 - (long)firstElement.exception)) >> 3) *
               -0x5555555555555555,ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}